

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsFieldAttachMetaData(FmsField field,FmsMetaData *mdata)

{
  long *in_RSI;
  long in_RDI;
  int err;
  FmsMetaData md;
  void *local_20;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (in_RDI == 0) {
    iVar1 = 1;
  }
  else if (in_RSI == (long *)0x0) {
    iVar1 = 2;
  }
  else {
    local_20 = *(void **)(in_RDI + 8);
    if (local_20 == (void *)0x0) {
      local_20 = calloc(1,0x20);
      if (local_20 == (void *)0x0) {
        return 3;
      }
      *(void **)(in_RDI + 8) = local_20;
    }
    else {
      iVar1 = FmsMetaDataClear((FmsMetaData)
                               CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    *in_RSI = (long)local_20;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int FmsFieldAttachMetaData(FmsField field, FmsMetaData *mdata) {
  if (!field) { E_RETURN(1); }
  if (!mdata) { E_RETURN(2); }
  FmsMetaData md = field->mdata;
  if (md == NULL) {
    md = calloc(1, sizeof(*md));
    if (md == NULL) { E_RETURN(3); }
    field->mdata = md;
  } else {
    int err = FmsMetaDataClear(md);
    if (err) { E_RETURN(err); }
  }
  *mdata = md;
  return 0;
}